

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_state.hpp
# Opt level: O2

dht_state * __thiscall libtorrent::dht::dht_state::operator=(dht_state *this,dht_state *param_1)

{
  ::std::
  vector<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
  ::_M_move_assign();
  ::std::
  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ::_M_move_assign(&this->nodes,&param_1->nodes);
  ::std::
  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ::_M_move_assign(&this->nodes6,&param_1->nodes6);
  return this;
}

Assistant:

struct TORRENT_EXPORT dht_state
	{
		node_ids_t nids;

		// the bootstrap nodes saved from the buckets node
		std::vector<udp::endpoint> nodes;
		// the bootstrap nodes saved from the IPv6 buckets node
		std::vector<udp::endpoint> nodes6;

		void clear();
	}